

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Load(TimeZoneInfo *this,ZoneInfoSource *zip)

{
  vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  *this_00;
  vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  *this_01;
  int_least64_t *piVar1;
  byte bVar2;
  uint_least8_t uVar3;
  pointer pTVar4;
  const_iterator cVar5;
  pointer pTVar6;
  size_t sVar7;
  char acVar8 [1];
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  uint_least8_t *puVar12;
  int_fast32_t iVar13;
  iterator iVar14;
  long lVar15;
  bool *pbVar16;
  TransitionType *tt;
  size_type __n;
  pointer cp;
  ZoneInfoSource *pZVar17;
  ZoneInfoSource *azip;
  size_t sVar18;
  byte bVar19;
  size_t i;
  long lVar20;
  pointer pTVar21;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> cVar22;
  ulong uStack_110;
  Header hdr;
  absolute_lookup local_a8;
  long local_88;
  ulong local_80;
  vector<char,_std::allocator<char>_> tbuf;
  tzhead tzh;
  
  iVar10 = (*zip->_vptr_ZoneInfoSource[2])(zip,&tzh,0x2c);
  if (CONCAT44(extraout_var,iVar10) != 0x2c) {
    return false;
  }
  if (tzh.tzh_magic != (char  [4])0x66695a54) {
    return false;
  }
  bVar9 = anon_unknown_0::Header::Build(&hdr,&tzh);
  acVar8[0] = tzh.tzh_version[0];
  if (!bVar9) {
    return false;
  }
  if (tzh.tzh_version[0] == '\0') {
    uStack_110 = 4;
  }
  else {
    iVar10 = (*zip->_vptr_ZoneInfoSource[3])
                       (zip,hdr.typecnt * 6 + hdr.timecnt * 5 + hdr.charcnt + hdr.leapcnt * 8 +
                            hdr.ttisstdcnt + hdr.ttisutcnt);
    if (iVar10 != 0) {
      return false;
    }
    iVar10 = (*zip->_vptr_ZoneInfoSource[2])(zip,&tzh,0x2c);
    if (CONCAT44(extraout_var_00,iVar10) != 0x2c) {
      return false;
    }
    if (tzh.tzh_magic != (char  [4])0x66695a54) {
      return false;
    }
    if (tzh.tzh_version[0] == '\0') {
      return false;
    }
    bVar9 = anon_unknown_0::Header::Build(&hdr,&tzh);
    if (!bVar9) {
      return false;
    }
    uStack_110 = 8;
  }
  sVar7 = hdr.charcnt;
  if ((((hdr.typecnt == 0) || (hdr.leapcnt != 0)) ||
      (hdr.ttisstdcnt != 0 && hdr.ttisstdcnt != hdr.typecnt)) ||
     (hdr.ttisutcnt != 0 && hdr.ttisutcnt != hdr.typecnt)) {
    return false;
  }
  __n = (uStack_110 | 1) * hdr.timecnt + hdr.charcnt +
        hdr.ttisstdcnt + hdr.ttisutcnt + hdr.typecnt * 6;
  std::vector<char,_std::allocator<char>_>::vector(&tbuf,__n,(allocator_type *)&local_a8);
  iVar10 = (*zip->_vptr_ZoneInfoSource[2])
                     (zip,tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,__n);
  if (CONCAT44(extraout_var_01,iVar10) == __n) {
    this_00 = &this->transitions_;
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::reserve(this_00,hdr.timecnt + 2);
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::resize(this_00,hdr.timecnt);
    local_88 = uStack_110 + 4;
    pTVar4 = (this_00->
             super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_80 = uStack_110;
    cp = tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    for (sVar18 = 0; sVar18 != hdr.timecnt; sVar18 = sVar18 + 1) {
      if (acVar8[0] == '\0') {
        uVar11 = anon_unknown_0::Decode32(cp);
        uStack_110 = local_80;
      }
      else {
        uVar11 = 0;
        for (lVar15 = 0; (int)lVar15 != 8; lVar15 = lVar15 + 1) {
          uVar11 = uVar11 << 8 | (ulong)(byte)cp[lVar15];
        }
      }
      pTVar4[sVar18].unix_time = uVar11;
      cp = cp + uStack_110;
      if ((sVar18 != 0) && ((long)uVar11 <= pTVar4[sVar18 - 1].unix_time)) {
        if (sVar18 != hdr.timecnt) goto LAB_002fa204;
        break;
      }
    }
    puVar12 = &((this_00->
                super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                )._M_impl.super__Vector_impl_data._M_start)->type_index;
    bVar19 = 0;
    for (sVar18 = 0; hdr.timecnt != sVar18; sVar18 = sVar18 + 1) {
      bVar2 = cp[sVar18];
      *puVar12 = bVar2;
      if (hdr.typecnt <= bVar2) goto LAB_002fa204;
      bVar19 = bVar19 | bVar2 == 0;
      puVar12 = puVar12 + 0x30;
    }
    this_01 = &this->transition_types_;
    std::
    vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
    ::reserve(this_01,hdr.typecnt + 2);
    std::
    vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
    ::resize(this_01,hdr.typecnt);
    pZVar17 = (ZoneInfoSource *)(cp + sVar18);
    pTVar21 = (this_01->
              super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar12 = &pTVar21->abbr_index;
    sVar18 = hdr.typecnt;
    while (bVar9 = sVar18 != 0, sVar18 = sVar18 - 1, bVar9) {
      iVar13 = anon_unknown_0::Decode32((char *)pZVar17);
      ((TransitionType *)(puVar12 + -0x29))->utc_offset = (int)iVar13;
      if ((int)iVar13 - 0x15180U < 0xfffd5d01) goto LAB_002fa204;
      puVar12[-1] = *(char *)((long)&pZVar17->_vptr_ZoneInfoSource + 4) != '\0';
      bVar2 = *(byte *)((long)&pZVar17->_vptr_ZoneInfoSource + 5);
      *puVar12 = bVar2;
      if (sVar7 <= bVar2) goto LAB_002fa204;
      pZVar17 = (ZoneInfoSource *)((long)&pZVar17->_vptr_ZoneInfoSource + 6);
      puVar12 = puVar12 + 0x30;
    }
    this->default_transition_type_ = '\0';
    if (!(bool)(~bVar19 & 1 | hdr.timecnt == 0)) {
      if (pTVar21->is_dst == true) {
        uVar11 = (ulong)((this_00->
                         super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                         )._M_impl.super__Vector_impl_data._M_start)->type_index;
        pbVar16 = &pTVar21[uVar11].is_dst;
        while (uVar11 != 0) {
          if (*pbVar16 != true) goto LAB_002f9fe8;
          pbVar16 = pbVar16 + -0x30;
          uVar11 = uVar11 - 1;
        }
      }
      uVar11 = 0;
LAB_002f9fe8:
      do {
        if (hdr.typecnt == (uVar11 & 0xff)) break;
        if (pTVar21[uVar11 & 0xff].is_dst != true) {
          this->default_transition_type_ = (uint_fast8_t)uVar11;
          break;
        }
        uVar11 = (ulong)(byte)((uint_fast8_t)uVar11 + 1);
      } while( true );
    }
    std::__cxx11::string::reserve((ulong)&this->abbreviations_);
    azip = pZVar17;
    std::__cxx11::string::assign((char *)&this->abbreviations_,(ulong)pZVar17);
    if ((char *)((long)&pZVar17->_vptr_ZoneInfoSource +
                local_88 * hdr.leapcnt + hdr.charcnt + hdr.ttisstdcnt + hdr.ttisutcnt) !=
        tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      __assert_fail("bp == tbuf.data() + tbuf.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                    ,0x2d9,"bool absl::time_internal::cctz::TimeZoneInfo::Load(ZoneInfoSource *)");
    }
    (this->future_spec_)._M_string_length = 0;
    *(this->future_spec_)._M_dataplus._M_p = '\0';
    if (tzh.tzh_version[0] == '\0') {
LAB_002fa0b7:
      if ((this->version_)._M_string_length == 0) {
        (*zip->_vptr_ZoneInfoSource[4])(&local_a8,zip);
        std::__cxx11::string::operator=((string *)&this->version_,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      cVar5._M_current =
           (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if ((cVar5._M_current ==
           (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish) || (-1 < (cVar5._M_current)->unix_time)) {
        iVar14 = std::
                 vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ::_M_emplace_aux<>(this_00,cVar5);
        (iVar14._M_current)->unix_time = -0x800000000000000;
        (iVar14._M_current)->type_index = this->default_transition_type_;
      }
      bVar9 = ExtendTransitions(this);
      if (bVar9) {
        cVar5._M_current =
             (this->transitions_).
             super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (cVar5._M_current[-1].unix_time < 0) {
          uVar3 = cVar5._M_current[-1].type_index;
          iVar14 = std::
                   vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ::_M_emplace_aux<>(this_00,cVar5);
          (iVar14._M_current)->unix_time = 0x7fffffff;
          (iVar14._M_current)->type_index = uVar3;
        }
        tt = (this->transition_types_).
             super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
             ._M_impl.super__Vector_impl_data._M_start + this->default_transition_type_;
        lVar15 = 0x10;
        for (lVar20 = 0;
            pTVar4 = (this->transitions_).
                     super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            lVar20 != ((long)(this->transitions_).
                             super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x30;
            lVar20 = lVar20 + 1) {
          LocalTime(&local_a8,this,*(int_fast64_t *)((long)pTVar4 + lVar15 + -0x10),tt);
          cVar22.f_.m = '\x01';
          cVar22.f_.d = '\0';
          cVar22.f_.hh = '\0';
          cVar22.f_.mm = '\0';
          cVar22.f_.ss = '\0';
          cVar22.f_._13_3_ = 0;
          cVar22.f_.y._0_1_ = local_a8.cs.f_.m;
          cVar22.f_.y._1_1_ = local_a8.cs.f_.d;
          cVar22.f_.y._2_1_ = local_a8.cs.f_.hh;
          cVar22.f_.y._3_1_ = local_a8.cs.f_.mm;
          cVar22.f_.y._4_1_ = local_a8.cs.f_.ss;
          cVar22.f_.y._5_3_ = local_a8.cs.f_._13_3_;
          cVar22 = detail::operator-((detail *)local_a8.cs.f_.y,cVar22,(diff_t)tt);
          *(int_least64_t *)((long)&(pTVar4->civil_sec).f_.y + lVar15) = cVar22.f_.y;
          *(long *)(&(pTVar4->civil_sec).f_.m + lVar15) = cVar22.f_._8_8_;
          tt = (this->transition_types_).
               super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start + *(byte *)((long)pTVar4 + lVar15 + -8);
          LocalTime(&local_a8,this,*(int_fast64_t *)((long)pTVar4 + lVar15 + -0x10),tt);
          piVar1 = (int_least64_t *)((long)&pTVar4->unix_time + lVar15);
          *piVar1 = local_a8.cs.f_.y;
          piVar1[1] = local_a8.cs.f_._8_8_;
          if ((lVar20 != 0) &&
             (bVar9 = detail::operator<((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                         *)((long)&(this_00->
                                                                                                      
                                                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[-1].
                                                  unix_time + lVar15),
                                        (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                         *)((long)&pTVar4->unix_time + lVar15)), !bVar9))
          goto LAB_002fa204;
          lVar15 = lVar15 + 0x30;
        }
        pTVar6 = (this->transition_types_).
                 super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pTVar21 = (this->transition_types_).
                       super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar21 != pTVar6;
            pTVar21 = pTVar21 + 1) {
          LocalTime(&local_a8,this,0x7fffffffffffffff,pTVar21);
          (pTVar21->civil_max).f_.y = local_a8.cs.f_.y;
          (pTVar21->civil_max).f_.m = local_a8.cs.f_.m;
          (pTVar21->civil_max).f_.d = local_a8.cs.f_.d;
          (pTVar21->civil_max).f_.hh = local_a8.cs.f_.hh;
          (pTVar21->civil_max).f_.mm = local_a8.cs.f_.mm;
          (pTVar21->civil_max).f_.ss = local_a8.cs.f_.ss;
          *(undefined3 *)&(pTVar21->civil_max).f_.field_0xd = local_a8.cs.f_._13_3_;
          LocalTime(&local_a8,this,-0x8000000000000000,pTVar21);
          (pTVar21->civil_min).f_.y = local_a8.cs.f_.y;
          (pTVar21->civil_min).f_.m = local_a8.cs.f_.m;
          (pTVar21->civil_min).f_.d = local_a8.cs.f_.d;
          (pTVar21->civil_min).f_.hh = local_a8.cs.f_.hh;
          (pTVar21->civil_min).f_.mm = local_a8.cs.f_.mm;
          (pTVar21->civil_min).f_.ss = local_a8.cs.f_.ss;
          *(undefined3 *)&(pTVar21->civil_min).f_.field_0xd = local_a8.cs.f_._13_3_;
        }
        std::
        vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
        ::_M_shrink_to_fit(this_00);
        bVar9 = true;
        goto LAB_002fa206;
      }
    }
    else {
      iVar10 = Load::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)zip,azip);
      if (iVar10 == 10) {
        iVar10 = Load::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)zip,azip);
        while (iVar10 != -1) {
          if (iVar10 == 10) goto LAB_002fa0b7;
          pZVar17 = (ZoneInfoSource *)(ulong)(uint)(int)(char)iVar10;
          std::__cxx11::string::push_back((char)this + -0x80);
          iVar10 = Load::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)zip,pZVar17)
          ;
        }
      }
    }
  }
LAB_002fa204:
  bVar9 = false;
LAB_002fa206:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tbuf.super__Vector_base<char,_std::allocator<char>_>);
  return bVar9;
}

Assistant:

bool TimeZoneInfo::Load(ZoneInfoSource* zip) {
  // Read and validate the header.
  tzhead tzh;
  if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
  if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
    return false;
  Header hdr;
  if (!hdr.Build(tzh)) return false;
  std::size_t time_len = 4;
  if (tzh.tzh_version[0] != '\0') {
    // Skip the 4-byte data.
    if (zip->Skip(hdr.DataLength(time_len)) != 0) return false;
    // Read and validate the header for the 8-byte data.
    if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
    if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
      return false;
    if (tzh.tzh_version[0] == '\0') return false;
    if (!hdr.Build(tzh)) return false;
    time_len = 8;
  }
  if (hdr.typecnt == 0) return false;
  if (hdr.leapcnt != 0) {
    // This code assumes 60-second minutes so we do not want
    // the leap-second encoded zoneinfo. We could reverse the
    // compensation, but the "right" encoding is rarely used
    // so currently we simply reject such data.
    return false;
  }
  if (hdr.ttisstdcnt != 0 && hdr.ttisstdcnt != hdr.typecnt) return false;
  if (hdr.ttisutcnt != 0 && hdr.ttisutcnt != hdr.typecnt) return false;

  // Read the data into a local buffer.
  std::size_t len = hdr.DataLength(time_len);
  std::vector<char> tbuf(len);
  if (zip->Read(tbuf.data(), len) != len) return false;
  const char* bp = tbuf.data();

  // Decode and validate the transitions.
  transitions_.reserve(hdr.timecnt + 2);
  transitions_.resize(hdr.timecnt);
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].unix_time = (time_len == 4) ? Decode32(bp) : Decode64(bp);
    bp += time_len;
    if (i != 0) {
      // Check that the transitions are ordered by time (as zic guarantees).
      if (!Transition::ByUnixTime()(transitions_[i - 1], transitions_[i]))
        return false;  // out of order
    }
  }
  bool seen_type_0 = false;
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].type_index = Decode8(bp++);
    if (transitions_[i].type_index >= hdr.typecnt) return false;
    if (transitions_[i].type_index == 0) seen_type_0 = true;
  }

  // Decode and validate the transition types.
  transition_types_.reserve(hdr.typecnt + 2);
  transition_types_.resize(hdr.typecnt);
  for (std::size_t i = 0; i != hdr.typecnt; ++i) {
    transition_types_[i].utc_offset =
        static_cast<std::int_least32_t>(Decode32(bp));
    if (transition_types_[i].utc_offset >= kSecsPerDay ||
        transition_types_[i].utc_offset <= -kSecsPerDay)
      return false;
    bp += 4;
    transition_types_[i].is_dst = (Decode8(bp++) != 0);
    transition_types_[i].abbr_index = Decode8(bp++);
    if (transition_types_[i].abbr_index >= hdr.charcnt) return false;
  }

  // Determine the before-first-transition type.
  default_transition_type_ = 0;
  if (seen_type_0 && hdr.timecnt != 0) {
    std::uint_fast8_t index = 0;
    if (transition_types_[0].is_dst) {
      index = transitions_[0].type_index;
      while (index != 0 && transition_types_[index].is_dst) --index;
    }
    while (index != hdr.typecnt && transition_types_[index].is_dst) ++index;
    if (index != hdr.typecnt) default_transition_type_ = index;
  }

  // Copy all the abbreviations.
  abbreviations_.reserve(hdr.charcnt + 10);
  abbreviations_.assign(bp, hdr.charcnt);
  bp += hdr.charcnt;

  // Skip the unused portions. We've already dispensed with leap-second
  // encoded zoneinfo. The ttisstd/ttisgmt indicators only apply when
  // interpreting a POSIX spec that does not include start/end rules, and
  // that isn't the case here (see "zic -p").
  bp += (time_len + 4) * hdr.leapcnt;  // leap-time + TAI-UTC
  bp += 1 * hdr.ttisstdcnt;            // UTC/local indicators
  bp += 1 * hdr.ttisutcnt;             // standard/wall indicators
  assert(bp == tbuf.data() + tbuf.size());

  future_spec_.clear();
  if (tzh.tzh_version[0] != '\0') {
    // Snarf up the NL-enclosed future POSIX spec. Note
    // that version '3' files utilize an extended format.
    auto get_char = [](ZoneInfoSource* azip) -> int {
      unsigned char ch;  // all non-EOF results are positive
      return (azip->Read(&ch, 1) == 1) ? ch : EOF;
    };
    if (get_char(zip) != '\n') return false;
    for (int c = get_char(zip); c != '\n'; c = get_char(zip)) {
      if (c == EOF) return false;
      future_spec_.push_back(static_cast<char>(c));
    }
  }

  // We don't check for EOF so that we're forwards compatible.

  // If we did not find version information during the standard loading
  // process (as of tzh_version '3' that is unsupported), then ask the
  // ZoneInfoSource for any out-of-bound version string it may be privy to.
  if (version_.empty()) {
    version_ = zip->Version();
  }

  // Ensure that there is always a transition in the first half of the
  // time line (the second half is handled below) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  if (transitions_.empty() || transitions_.front().unix_time >= 0) {
    Transition& tr(*transitions_.emplace(transitions_.begin()));
    tr.unix_time = -(1LL << 59);  // -18267312070-10-26T17:01:52+00:00
    tr.type_index = default_transition_type_;
  }

  // Extend the transitions using the future specification.
  if (!ExtendTransitions()) return false;

  // Ensure that there is always a transition in the second half of the
  // time line (the first half is handled above) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  const Transition& last(transitions_.back());
  if (last.unix_time < 0) {
    const std::uint_fast8_t type_index = last.type_index;
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = 2147483647;  // 2038-01-19T03:14:07+00:00
    tr.type_index = type_index;
  }

  // Compute the local civil time for each transition and the preceding
  // second. These will be used for reverse conversions in MakeTime().
  const TransitionType* ttp = &transition_types_[default_transition_type_];
  for (std::size_t i = 0; i != transitions_.size(); ++i) {
    Transition& tr(transitions_[i]);
    tr.prev_civil_sec = LocalTime(tr.unix_time, *ttp).cs - 1;
    ttp = &transition_types_[tr.type_index];
    tr.civil_sec = LocalTime(tr.unix_time, *ttp).cs;
    if (i != 0) {
      // Check that the transitions are ordered by civil time. Essentially
      // this means that an offset change cannot cross another such change.
      // No one does this in practice, and we depend on it in MakeTime().
      if (!Transition::ByCivilTime()(transitions_[i - 1], tr))
        return false;  // out of order
    }
  }

  // Compute the maximum/minimum civil times that can be converted to a
  // time_point<seconds> for each of the zone's transition types.
  for (auto& tt : transition_types_) {
    tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
    tt.civil_min = LocalTime(seconds::min().count(), tt).cs;
  }

  transitions_.shrink_to_fit();
  return true;
}